

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

void __thiscall
helics::MessageFederateManager::removeOrderedMessage(MessageFederateManager *this,uint index)

{
  pointer puVar1;
  const_iterator cVar2;
  const_iterator __position;
  handle handle;
  handle local_28;
  
  gmlc::libguarded::
  guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::lock
            (&local_28,&this->messageOrder);
  puVar1 = ((local_28.data)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  cVar2._M_current = puVar1 + -1;
  if (puVar1[-1] == index) {
    ((local_28.data)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = cVar2._M_current;
  }
  else {
    do {
      __position._M_current = cVar2._M_current;
      if (__position._M_current ==
          ((local_28.data)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
          .super__Vector_impl_data._M_start) goto LAB_001b3706;
      cVar2._M_current = __position._M_current + -1;
    } while (__position._M_current[-1] != index);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase(local_28.data,__position);
  }
LAB_001b3706:
  std::unique_lock<std::mutex>::~unique_lock(&local_28.m_handle_lock);
  return;
}

Assistant:

void MessageFederateManager::removeOrderedMessage(unsigned int index)
{
    auto handle = messageOrder.lock();
    if (index == handle->back()) {
        handle->pop_back();
    } else {
        auto term = handle->rend();
        for (auto ri = handle->rbegin() + 1; ri != term; ++ri) {
            if (*ri == index) {
                handle->erase(ri.base());
                break;
            }
        }
    }
}